

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlwaysFFAssignmentOutsideConditional.cpp
# Opt level: O2

void __thiscall
always_ff_assignment_outside_conditional::MainVisitor::handle
          (MainVisitor *this,VariableSymbol *symbol)

{
  long lVar1;
  bool bVar2;
  Diagnostic *this_00;
  SourceLocation *pSVar3;
  EVP_PKEY_CTX *ctx;
  string_view path;
  AlwaysFFVisitor visitor;
  undefined1 local_e8 [48];
  bool local_b8;
  const_iterator local_68;
  
  ctx = (EVP_PKEY_CTX *)local_e8;
  path = slang::SourceManager::getFileName
                   (*(SourceManager **)this,(symbol->super_ValueSymbol).super_Symbol.location);
  bVar2 = TidyVisitor::skip((TidyVisitor *)this,path);
  if (!bVar2) {
    slang::ast::ValueSymbol::drivers
              ((subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
                *)local_e8,&symbol->super_ValueSymbol);
    bVar2 = std::ranges::
            subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
            ::empty((subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
                     *)local_e8);
    std::ranges::
    subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
    ::~subrange((subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
                 *)local_e8);
    if (!bVar2) {
      slang::ast::ValueSymbol::drivers
                ((subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
                  *)local_e8,&symbol->super_ValueSymbol);
      slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator::
      const_iterator(&local_68,(const_iterator *)local_e8);
      lVar1 = *(long *)((long)local_68.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                              [local_68.path.path.
                               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1
                              ].node +
                       (ulong)local_68.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                              [local_68.path.path.
                               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1
                              ].offset * 8 + 0x80);
      slang::SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
                ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&local_68.path,ctx);
      std::ranges::
      subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
      ::~subrange((subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
                   *)local_e8);
      if ((lVar1 != 0) && (*(char *)(lVar1 + 0x1a) == '\x05')) {
        local_e8._0_8_ = (symbol->super_ValueSymbol).super_Symbol.name._M_len;
        local_e8._8_8_ = (symbol->super_ValueSymbol).super_Symbol.name._M_str;
        local_e8._24_8_ = *(size_type *)(*(long *)(this + 0x10) + 0x60);
        local_e8._16_8_ = *(size_type *)(*(long *)(this + 0x10) + 0x68);
        local_e8._32_2_ = 0;
        local_b8 = false;
        slang::ast::Symbol::visit<always_ff_assignment_outside_conditional::AlwaysFFVisitor&>
                  (*(Symbol **)(lVar1 + 8),(AlwaysFFVisitor *)local_e8);
        if ((local_e8[0x20] == true) && ((local_e8._32_2_ & 0x100) != 0)) {
          pSVar3 = &(symbol->super_ValueSymbol).super_Symbol.location;
          if ((local_b8 & 1U) != 0) {
            pSVar3 = (SourceLocation *)(local_e8 + 0x28);
          }
          this_00 = slang::Diagnostics::add(*(Diagnostics **)(this + 8),(DiagCode)0x10010,*pSVar3);
          slang::Diagnostic::operator<<(this_00,(symbol->super_ValueSymbol).super_Symbol.name);
        }
      }
    }
  }
  return;
}

Assistant:

void handle(const VariableSymbol& symbol) {
        NEEDS_SKIP_SYMBOL(symbol)
        if (symbol.drivers().empty())
            return;

        auto firstDriver = *symbol.drivers().begin();
        if (firstDriver && firstDriver->source == DriverSource::AlwaysFF) {
            AlwaysFFVisitor visitor(symbol.name, config.getCheckConfigs().resetName);
            firstDriver->containingSymbol->visit(visitor);
            if (visitor.hasError()) {
                diags.add(diag::RegisterNotAssignedOnReset,
                          visitor.getErrorLocation().value_or(symbol.location))
                    << symbol.name;
            }
        }
    }